

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
          (ThreadCleanUpTest *this,EglTestContext *eglTestCtx,ContextType contextType,
          SurfaceType surfaceType)

{
  char *name;
  string local_40;
  SurfaceType local_20;
  ContextType local_1c;
  SurfaceType surfaceType_local;
  ContextType contextType_local;
  EglTestContext *eglTestCtx_local;
  ThreadCleanUpTest *this_local;
  
  local_20 = surfaceType;
  local_1c = contextType;
  _surfaceType_local = eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  egl::(anonymous_namespace)::ThreadCleanUpTest::testCaseName_abi_cxx11_
            (&local_40,(ThreadCleanUpTest *)(ulong)contextType,surfaceType,surfaceType);
  name = (char *)std::__cxx11::string::c_str();
  egl::TestCase::TestCase
            (&this->super_TestCase,eglTestCtx,name,"Simple thread context clean up test");
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ThreadCleanUpTest_0327a340;
  this->m_contextType = local_1c;
  this->m_surfaceType = local_20;
  this->m_iterCount = 0xfa;
  this->m_iterNdx = 0;
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  this->m_surface = (EGLSurface)0x0;
  this->m_context = (EGLContext)0x0;
  return;
}

Assistant:

ThreadCleanUpTest (EglTestContext& eglTestCtx, ContextType contextType, SurfaceType surfaceType)
		: TestCase			(eglTestCtx, testCaseName(contextType, surfaceType).c_str(), "Simple thread context clean up test")
		, m_contextType		(contextType)
		, m_surfaceType		(surfaceType)
		, m_iterCount		(250)
		, m_iterNdx			(0)
		, m_display			(EGL_NO_DISPLAY)
		, m_config			(0)
		, m_surface			(EGL_NO_SURFACE)
		, m_context			(EGL_NO_CONTEXT)
	{
	}